

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_inverse_var(secp256k1_scalar *r,secp256k1_scalar *x)

{
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_signed62 local_38;
  
  local_38.v[0] = x->d[0] & 0x3fffffffffffffff;
  local_38.v[1] = (x->d[1] & 0xfffffffffffffff) << 2 | x->d[0] >> 0x3e;
  local_38.v[2] = (x->d[2] & 0x3ffffffffffffff) << 4 | x->d[1] >> 0x3c;
  local_38.v[3] = (x->d[3] & 0xffffffffffffff) << 6 | x->d[2] >> 0x3a;
  local_38.v[4] = x->d[3] >> 0x38;
  secp256k1_modinv64_var(&local_38,&secp256k1_const_modinfo_scalar);
  r->d[0] = local_38.v[1] << 0x3e | local_38.v[0];
  r->d[1] = local_38.v[2] << 0x3c | (ulong)local_38.v[1] >> 2;
  r->d[2] = local_38.v[3] << 0x3a | (ulong)local_38.v[2] >> 4;
  r->d[3] = local_38.v[4] << 0x38 | (ulong)local_38.v[3] >> 6;
  return;
}

Assistant:

static void secp256k1_scalar_inverse_var(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}